

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void encodeImagePackBits(string *path)

{
  value_type_conflict *__x;
  bool bVar1;
  uchar *puVar2;
  FILE *__s;
  char cVar3;
  long lVar4;
  int i;
  ulong uVar5;
  int iVar6;
  int k;
  int iVar7;
  value_type_conflict *__x_00;
  int height;
  int width;
  vector<char,_std::allocator<char>_> occurence;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encodedPixels;
  string outputPath;
  int maximum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  char pSix [10];
  string local_50;
  
  width = 0;
  height = 0;
  maximum = 0;
  std::__cxx11::string::string((string *)&local_50,(string *)path);
  puVar2 = readPPM(&local_50,pSix,&width,&height,&maximum);
  std::__cxx11::string::~string((string *)&local_50);
  encodedPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encodedPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encodedPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __x_00 = puVar2 + 2;
  bVar1 = true;
  lVar4 = 0;
  do {
    if (width * height * 3 <= lVar4) {
      outputPath._M_dataplus._M_p._0_1_ = 0x80;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&occurence,(char *)&outputPath);
      std::__cxx11::string::substr((ulong)&local_80,(ulong)path);
      std::operator+(&outputPath,&local_80,"_packbits.rle");
      std::__cxx11::string::~string((string *)&local_80);
      __s = fopen((char *)CONCAT71(outputPath._M_dataplus._M_p._1_7_,
                                   outputPath._M_dataplus._M_p._0_1_),"wb");
      fwrite(&width,1,4,__s);
      fwrite(&height,1,4,__s);
      iVar6 = 0;
      for (uVar5 = 0;
          uVar5 < (ulong)((long)occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start); uVar5 = uVar5 + 1) {
        fputc((int)occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar5],__s);
        cVar3 = occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        if (cVar3 < '\0') {
          fwrite(encodedPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar6,1,3,__s);
          iVar6 = iVar6 + 3;
        }
        else {
          lVar4 = (long)iVar6;
          for (iVar7 = 0; iVar7 <= cVar3; iVar7 = iVar7 + 1) {
            fwrite(encodedPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar4,1,3,__s);
            lVar4 = lVar4 + 3;
            cVar3 = occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
            iVar6 = iVar6 + 3;
          }
        }
      }
      fclose(__s);
      std::__cxx11::string::~string((string *)&outputPath);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&occurence.super__Vector_base<char,_std::allocator<char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&encodedPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return;
    }
    __x = __x_00 + -2;
    if (bVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&encodedPixels,__x);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&encodedPixels,__x_00 + -1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&encodedPixels,__x_00);
      outputPath._M_dataplus._M_p._0_1_ = 0;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&occurence,(char *)&outputPath);
    }
    else if (((*__x == encodedPixels.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish[-3]) &&
             (__x_00[-1] ==
              encodedPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start
              [(long)(encodedPixels.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                     (-2 - (long)encodedPixels.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start))])) &&
            (*__x_00 ==
             encodedPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start
             [(long)(encodedPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_finish +
                    (-1 - (long)encodedPixels.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start))])) {
      cVar3 = occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      if (cVar3 < '\x01') {
        if (cVar3 != -0x7f) {
          cVar3 = cVar3 + -1;
          goto LAB_00103cba;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&encodedPixels,__x);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&encodedPixels,__x_00 + -1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&encodedPixels,__x_00)
        ;
        outputPath._M_dataplus._M_p._0_1_ = 0;
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(&occurence,(char *)&outputPath)
        ;
      }
      else {
        occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1] = cVar3 + -1;
        outputPath._M_dataplus._M_p._0_1_ = 0xff;
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(&occurence,(char *)&outputPath)
        ;
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&encodedPixels,__x);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&encodedPixels,__x_00 + -1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&encodedPixels,__x_00);
      if ((byte)occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish[-1] < 0x7f) {
        cVar3 = occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish[-1] + 1;
LAB_00103cba:
        occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1] = cVar3;
      }
      else {
        outputPath._M_dataplus._M_p._0_1_ = 0;
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(&occurence,(char *)&outputPath)
        ;
      }
    }
    lVar4 = lVar4 + 3;
    __x_00 = __x_00 + 3;
    bVar1 = false;
  } while( true );
}

Assistant:

void encodeImagePackBits(std::string path)
{
    char pSix[10];		// indicates this is a PPM image
    int width = 0;		// width of the image
    int height = 0;		// heigt of the image
    int maximum = 0;	// maximum pixel value

    // read the PPM file and store its contents inside an array and return the pointer to that array to pixelArray
    unsigned char* pixelArray = readPPM(path, pSix, width, height, maximum);
    std::vector <unsigned char> encodedPixels;
    std::vector <char> occurence;

    bool first = true;

    for (int i = 0; i < width * height * 3; i+=3)
    {
        if (first)
        {
            encodedPixels.push_back(pixelArray[i]);
            encodedPixels.push_back(pixelArray[i+1]);
            encodedPixels.push_back(pixelArray[i+2]);
            occurence.push_back(0);
            first = false;
            continue;
        }

        bool same = pixelArray[i] == encodedPixels[encodedPixels.size() - 3]
                    && pixelArray[i+1] == encodedPixels[encodedPixels.size() - 2]
                    && pixelArray[i+2] == encodedPixels[encodedPixels.size() - 1];

        if (same)
        {
            if (occurence.back() <= 0)
            {
                if (occurence.back() == -127)
                {
                    encodedPixels.push_back(pixelArray[i]);
                    encodedPixels.push_back(pixelArray[i+1]);
                    encodedPixels.push_back(pixelArray[i+2]);
                    occurence.push_back(0);
                }
                else
                    occurence.back()--;
            }
            else
            {
                occurence.back()--;
                occurence.push_back(-1);
            }
        }
        else
        {
            encodedPixels.push_back(pixelArray[i]);
            encodedPixels.push_back(pixelArray[i+1]);
            encodedPixels.push_back(pixelArray[i+2]);

            if (occurence.back() < 0 || occurence.back() == 127)
                occurence.push_back(0);
            else
                occurence.back()++;
        }
    }
    occurence.push_back(-128);

    string outputPath = path.substr(0, path.size()-4) + "_packbits.rle";
    FILE *fp = fopen(outputPath.c_str(), "wb");
    fwrite(&width, 1, sizeof(int), fp);
    fwrite(&height, 1, sizeof(int), fp);

    int pixelCounter = 0;
    for (int i = 0; i < occurence.size(); i++)
    {
        fwrite(&occurence[i], 1, 1, fp);
        // if n is negative, we have to  repeat 1 - n times
        if (occurence[i] < 0 && occurence[i] != -128)
        {
            fwrite(&encodedPixels[pixelCounter], 1, 3, fp);
            pixelCounter+=3;
        }
        else if (occurence[i] >= 0)
        {
            for (int k = 0; k < occurence[i] + 1; k++)
            {
                fwrite(&encodedPixels[pixelCounter], 1, 3, fp);
                pixelCounter+=3;
            }
        }
        else
        {
            break;
        }
    }
    fclose(fp);
}